

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

raw_problem_status read_quadratic_element(stream_buffer *buf,problem_parser *p,double sign_factor)

{
  basic_string_view<char,_std::char_traits<char>_> *pbVar1;
  basic_string_view<char,_std::char_traits<char>_> *pbVar2;
  basic_string_view<char,_std::char_traits<char>_> *pbVar3;
  basic_string_view<char,_std::char_traits<char>_> *pbVar4;
  basic_string_view<char,_std::char_traits<char>_> *pbVar5;
  basic_string_view<char,_std::char_traits<char>_> *pbVar6;
  basic_string_view<char,_std::char_traits<char>_> *pbVar7;
  string_view *psVar8;
  basic_string_view<char,_std::char_traits<char>_> *pbVar9;
  basic_string_view<char,_std::char_traits<char>_> *pbVar10;
  size_t sVar11;
  char *pcVar12;
  pointer poVar13;
  short *psVar14;
  char *pcVar15;
  size_t sVar16;
  char *pcVar17;
  string_view value;
  string_view value_00;
  string_view value_01;
  undefined8 uVar18;
  int iVar19;
  int iVar20;
  reference pvVar21;
  pointer poVar22;
  pointer poVar23;
  ulong uVar24;
  long lVar25;
  raw_problem_status rVar26;
  string_view sVar27;
  optional<function_element_token> fct_opt;
  _Storage<function_element_token,_true> local_88;
  char local_68;
  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  *local_60;
  size_t local_58;
  char *pcStack_50;
  size_t local_40;
  char *pcStack_38;
  
  uVar24 = 7;
  if (((buf->buffer_ptr)._M_elems[0]._M_len != 1) || (*(buf->buffer_ptr)._M_elems[0]._M_str != '['))
  {
LAB_00134094:
    rVar26.column = 0;
    rVar26.tag = (int)uVar24;
    rVar26.line = (int)(uVar24 >> 0x20);
    return rVar26;
  }
  local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
  local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
  pbVar1 = (buf->buffer_ptr)._M_elems + 1;
  pbVar2 = (buf->buffer_ptr)._M_elems + 2;
  pbVar3 = (buf->buffer_ptr)._M_elems + 3;
  pbVar4 = (buf->buffer_ptr)._M_elems + 4;
  pbVar5 = (buf->buffer_ptr)._M_elems + 5;
  pbVar6 = (buf->buffer_ptr)._M_elems + 6;
  pbVar7 = (buf->buffer_ptr)._M_elems + 7;
  pbVar9 = (buf->buffer_ptr)._M_elems + 8;
  pbVar10 = (buf->buffer_ptr)._M_elems + 9;
  pcVar12 = (buf->buffer_ptr)._M_elems[1]._M_str;
  sVar11 = (buf->buffer_ptr)._M_elems[2]._M_len;
  pcVar15 = (buf->buffer_ptr)._M_elems[2]._M_str;
  sVar16 = (buf->buffer_ptr)._M_elems[3]._M_len;
  pcVar17 = (buf->buffer_ptr)._M_elems[3]._M_str;
  (buf->buffer_ptr)._M_elems[0]._M_len = (buf->buffer_ptr)._M_elems[1]._M_len;
  (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
  (buf->buffer_ptr)._M_elems[1]._M_len = sVar11;
  (buf->buffer_ptr)._M_elems[1]._M_str = pcVar15;
  (buf->buffer_ptr)._M_elems[2]._M_len = sVar16;
  (buf->buffer_ptr)._M_elems[2]._M_str = pcVar17;
  pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
  sVar11 = (buf->buffer_ptr)._M_elems[5]._M_len;
  pcVar15 = (buf->buffer_ptr)._M_elems[5]._M_str;
  (buf->buffer_ptr)._M_elems[3]._M_len = (buf->buffer_ptr)._M_elems[4]._M_len;
  (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
  (buf->buffer_ptr)._M_elems[4]._M_len = sVar11;
  (buf->buffer_ptr)._M_elems[4]._M_str = pcVar15;
  pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
  sVar11 = (buf->buffer_ptr)._M_elems[7]._M_len;
  pcVar15 = (buf->buffer_ptr)._M_elems[7]._M_str;
  (buf->buffer_ptr)._M_elems[5]._M_len = (buf->buffer_ptr)._M_elems[6]._M_len;
  (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
  (buf->buffer_ptr)._M_elems[6]._M_len = sVar11;
  (buf->buffer_ptr)._M_elems[6]._M_str = pcVar15;
  pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
  (buf->buffer_ptr)._M_elems[7]._M_len = (buf->buffer_ptr)._M_elems[8]._M_len;
  (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
  (buf->buffer_ptr)._M_elems[8]._M_len = (buf->buffer_ptr)._M_elems[9]._M_len;
  (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
  (buf->buffer_ptr)._M_elems[9]._M_len = (size_t)local_88._M_value.factor;
  (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
  sVar27 = stream_buffer::next_token(buf);
  local_60 = &(p->m_problem).objective.qelements;
  (buf->buffer_ptr)._M_elems[9] = sVar27;
LAB_001337e6:
  do {
    uVar24 = 7;
    sVar11 = (buf->buffer_ptr)._M_elems[0]._M_len;
    sVar27._M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
    sVar27._M_str = (buf->buffer_ptr)._M_elems[0]._M_str;
    if (sVar11 == 1) {
      if (*(buf->buffer_ptr)._M_elems[0]._M_str == ']') goto LAB_00133e4a;
    }
    else if (sVar11 == 0) {
LAB_00133e4a:
      local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
      local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
      pcVar12 = (buf->buffer_ptr)._M_elems[1]._M_str;
      (buf->buffer_ptr)._M_elems[0]._M_len = pbVar1->_M_len;
      (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
      pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
      pbVar1->_M_len = pbVar2->_M_len;
      (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
      pcVar12 = (buf->buffer_ptr)._M_elems[3]._M_str;
      pbVar2->_M_len = pbVar3->_M_len;
      (buf->buffer_ptr)._M_elems[2]._M_str = pcVar12;
      pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
      pbVar3->_M_len = pbVar4->_M_len;
      (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
      pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
      pbVar4->_M_len = pbVar5->_M_len;
      (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
      pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
      pbVar5->_M_len = pbVar6->_M_len;
      (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
      pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
      pbVar6->_M_len = pbVar7->_M_len;
      (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
      pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
      pbVar7->_M_len = pbVar9->_M_len;
      (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
      pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
      pbVar9->_M_len = pbVar10->_M_len;
      (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
      pbVar10->_M_len = (size_t)local_88._M_value.factor;
      (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
      sVar27 = stream_buffer::next_token(buf);
      (buf->buffer_ptr)._M_elems[9] = sVar27;
      sVar11 = (buf->buffer_ptr)._M_elems[0]._M_len;
      psVar14 = (short *)(buf->buffer_ptr)._M_elems[0]._M_str;
      if (sVar11 == 2) {
        if (*psVar14 == 0x322f) {
          local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
          local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
          pcVar12 = (buf->buffer_ptr)._M_elems[1]._M_str;
          (buf->buffer_ptr)._M_elems[0]._M_len = pbVar1->_M_len;
          (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
          pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
          pbVar1->_M_len = pbVar2->_M_len;
          (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
          pcVar12 = (buf->buffer_ptr)._M_elems[3]._M_str;
          pbVar2->_M_len = pbVar3->_M_len;
          (buf->buffer_ptr)._M_elems[2]._M_str = pcVar12;
          pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
          pbVar3->_M_len = pbVar4->_M_len;
          (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
          pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
          pbVar4->_M_len = pbVar5->_M_len;
          (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
          pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
          pbVar5->_M_len = pbVar6->_M_len;
          (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
          pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
          pbVar6->_M_len = pbVar7->_M_len;
          (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
          pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
          pbVar7->_M_len = pbVar9->_M_len;
          (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
          pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
          pbVar9->_M_len = pbVar10->_M_len;
          (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
          pbVar10->_M_len = (size_t)local_88._M_value.factor;
          (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
          sVar27 = stream_buffer::next_token(buf);
          (buf->buffer_ptr)._M_elems[9] = sVar27;
          goto LAB_00134091;
        }
      }
      else if ((((sVar11 == 1) && ((char)*psVar14 == '/')) && (pbVar1->_M_len == 1)) &&
              (*(buf->buffer_ptr)._M_elems[1]._M_str == '2')) {
        local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
        local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
        lVar25 = 0x88;
        pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
        (buf->buffer_ptr)._M_elems[0]._M_len = pbVar2->_M_len;
        (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[3]._M_str;
        pbVar1->_M_len = pbVar3->_M_len;
        (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
        pbVar2->_M_len = pbVar4->_M_len;
        (buf->buffer_ptr)._M_elems[2]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
        pbVar3->_M_len = pbVar5->_M_len;
        (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
        pbVar4->_M_len = pbVar6->_M_len;
        (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
        pbVar5->_M_len = pbVar7->_M_len;
        (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
        pbVar6->_M_len = pbVar9->_M_len;
        (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
        pbVar7->_M_len = pbVar10->_M_len;
        (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[0]._M_str;
        pbVar9->_M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
        pbVar10->_M_len = (size_t)local_88._M_value.factor;
        (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
        do {
          sVar27 = stream_buffer::next_token(buf);
          *(size_t *)((long)(buf->buffer_ptr)._M_elems + lVar25 + -8) = sVar27._M_len;
          *(char **)((long)&(buf->buffer_ptr)._M_elems[0]._M_len + lVar25) = sVar27._M_str;
          lVar25 = lVar25 + 0x10;
        } while (lVar25 != 0xa8);
LAB_00134091:
        uVar24 = 0;
      }
      goto LAB_00134094;
    }
    psVar8 = (buf->buffer_ptr)._M_elems + 2;
    local_40 = psVar8->_M_len;
    pcStack_38 = (buf->buffer_ptr)._M_elems[2]._M_str;
    read_quadratic_element
              ((optional<function_element_token> *)&local_88._M_value,sVar27,
               (buf->buffer_ptr)._M_elems[1],*psVar8);
    uVar18 = local_88._M_value.factor;
    if (local_68 == '\0') goto LAB_00134094;
    value_01._M_str._0_1_ = local_88._16_1_;
    value_01._M_len = local_88._M_value.name._M_len;
    value_01._M_str._1_7_ = local_88._17_7_;
    value_00._M_str._0_1_ = local_88._16_1_;
    value_00._M_len = local_88._M_value.name._M_len;
    value_00._M_str._1_7_ = local_88._17_7_;
    stream_buffer::pop_front(buf,local_88._M_value.read);
    sVar11 = (buf->buffer_ptr)._M_elems[0]._M_len;
    pcVar12 = (buf->buffer_ptr)._M_elems[0]._M_str;
    if (sVar11 == 2) break;
    if (sVar11 == 1) {
      if (*pcVar12 == '*') {
        read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                  &local_88._M_value,(buf->buffer_ptr)._M_elems[1]);
        if (local_88._16_1_ == '\0') goto LAB_00134094;
        iVar19 = problem_parser::get_or_assign_variable(p,value_00);
        value._M_str = (char *)local_88._M_value.name._M_len;
        value._M_len = (size_t)local_88._M_value.factor;
        iVar20 = problem_parser::get_or_assign_variable(p,value);
        if ((iVar19 == -1) || (iVar20 == -1)) goto LAB_00133fdd;
        poVar13 = (p->m_problem).objective.qelements.
                  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        poVar23 = (p->m_problem).objective.qelements.
                  super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar24 = (long)poVar13 - (long)poVar23;
        if (0 < (long)uVar24 >> 6) {
          lVar25 = ((long)uVar24 >> 6) + 1;
          poVar22 = (pointer)((long)&poVar23->factor + (uVar24 & 0xffffffffffffffc0));
          poVar23 = poVar23 + 2;
          do {
            if ((poVar23[-2].variable_index_b == iVar20 && poVar23[-2].variable_index_a == iVar19)
               || ((poVar23[-2].variable_index_a == iVar20 &&
                   (poVar23[-2].variable_index_b == iVar19)))) {
              poVar23 = poVar23 + -2;
              goto LAB_00133d40;
            }
            if ((poVar23[-1].variable_index_b == iVar20 && poVar23[-1].variable_index_a == iVar19)
               || ((poVar23[-1].variable_index_a == iVar20 &&
                   (poVar23[-1].variable_index_b == iVar19)))) {
              poVar23 = poVar23 + -1;
              goto LAB_00133d40;
            }
            if ((poVar23->variable_index_b == iVar20 && poVar23->variable_index_a == iVar19) ||
               ((poVar23->variable_index_a == iVar20 && (poVar23->variable_index_b == iVar19))))
            goto LAB_00133d40;
            if ((poVar23[1].variable_index_b == iVar20 && poVar23[1].variable_index_a == iVar19) ||
               ((poVar23[1].variable_index_a == iVar20 && (poVar23[1].variable_index_b == iVar19))))
            {
              poVar23 = poVar23 + 1;
              goto LAB_00133d40;
            }
            lVar25 = lVar25 + -1;
            poVar23 = poVar23 + 4;
          } while (1 < lVar25);
          uVar24 = (long)poVar13 - (long)poVar22;
          poVar23 = poVar22;
        }
        lVar25 = (long)uVar24 >> 4;
        if (lVar25 == 1) {
LAB_00133ca5:
          if ((poVar23->variable_index_b != iVar20 || poVar23->variable_index_a != iVar19) &&
             (poVar23->variable_index_b != iVar19 || poVar23->variable_index_a != iVar20)) {
            poVar23 = poVar13;
          }
LAB_00133d40:
          if (poVar23 == poVar13) goto LAB_00133d63;
          poVar23->factor = (double)uVar18 * sign_factor * 0.5 + poVar23->factor;
        }
        else {
          if (lVar25 == 2) {
LAB_00133c83:
            if ((poVar23->variable_index_b != iVar20 || poVar23->variable_index_a != iVar19) &&
               ((poVar23->variable_index_a != iVar20 || (poVar23->variable_index_b != iVar19)))) {
              poVar23 = poVar23 + 1;
              goto LAB_00133ca5;
            }
            goto LAB_00133d40;
          }
          if (lVar25 == 3) {
            if ((poVar23->variable_index_b != iVar20 || poVar23->variable_index_a != iVar19) &&
               ((poVar23->variable_index_a != iVar20 || (poVar23->variable_index_b != iVar19)))) {
              poVar23 = poVar23 + 1;
              goto LAB_00133c83;
            }
            goto LAB_00133d40;
          }
LAB_00133d63:
          pvVar21 = std::
                    vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                    ::emplace_back<>(local_60);
          pvVar21->factor = (double)uVar18 * sign_factor * 0.5;
          pvVar21->variable_index_a = iVar19;
          pvVar21->variable_index_b = iVar20;
        }
        local_58 = (buf->buffer_ptr)._M_elems[0]._M_len;
        pcStack_50 = (buf->buffer_ptr)._M_elems[0]._M_str;
        lVar25 = 0x88;
        pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
        (buf->buffer_ptr)._M_elems[0]._M_len = pbVar2->_M_len;
        (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[3]._M_str;
        pbVar1->_M_len = pbVar3->_M_len;
        (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
        pbVar2->_M_len = pbVar4->_M_len;
        (buf->buffer_ptr)._M_elems[2]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
        pbVar3->_M_len = pbVar5->_M_len;
        (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
        pbVar4->_M_len = pbVar6->_M_len;
        (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
        pbVar5->_M_len = pbVar7->_M_len;
        (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
        pbVar6->_M_len = pbVar9->_M_len;
        (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
        pbVar7->_M_len = pbVar10->_M_len;
        (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[0]._M_str;
        pbVar9->_M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
        pbVar10->_M_len = local_58;
        (buf->buffer_ptr)._M_elems[9]._M_str = pcStack_50;
        do {
          sVar27 = stream_buffer::next_token(buf);
          *(size_t *)((long)(buf->buffer_ptr)._M_elems + lVar25 + -8) = sVar27._M_len;
          *(char **)((long)&(buf->buffer_ptr)._M_elems[0]._M_len + lVar25) = sVar27._M_str;
          lVar25 = lVar25 + 0x10;
        } while (lVar25 != 0xa8);
      }
      else if (*pcVar12 == '^') {
        if ((pbVar1->_M_len != 1) || (*(buf->buffer_ptr)._M_elems[1]._M_str != '2'))
        goto LAB_00133ac4;
        local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
        local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
        lVar25 = 0x88;
        pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
        (buf->buffer_ptr)._M_elems[0]._M_len = pbVar2->_M_len;
        (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[3]._M_str;
        pbVar1->_M_len = pbVar3->_M_len;
        (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
        pbVar2->_M_len = pbVar4->_M_len;
        (buf->buffer_ptr)._M_elems[2]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
        pbVar3->_M_len = pbVar5->_M_len;
        (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
        pbVar4->_M_len = pbVar6->_M_len;
        (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
        pbVar5->_M_len = pbVar7->_M_len;
        (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
        pbVar6->_M_len = pbVar9->_M_len;
        (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
        pbVar7->_M_len = pbVar10->_M_len;
        (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
        pcVar12 = (buf->buffer_ptr)._M_elems[0]._M_str;
        pbVar9->_M_len = (buf->buffer_ptr)._M_elems[0]._M_len;
        (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
        pbVar10->_M_len = (size_t)local_88._M_value.factor;
        (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
        do {
          sVar27 = stream_buffer::next_token(buf);
          *(size_t *)((long)(buf->buffer_ptr)._M_elems + lVar25 + -8) = sVar27._M_len;
          *(char **)((long)&(buf->buffer_ptr)._M_elems[0]._M_len + lVar25) = sVar27._M_str;
          lVar25 = lVar25 + 0x10;
        } while (lVar25 != 0xa8);
        goto LAB_00133b62;
      }
    }
  } while( true );
  iVar19 = bcmp(pcVar12,"^2",2);
  if (iVar19 != 0) goto LAB_001337e6;
LAB_00133ac4:
  local_88._M_value.factor = (double)(buf->buffer_ptr)._M_elems[0]._M_len;
  local_88._M_value.name._M_len = (size_t)(buf->buffer_ptr)._M_elems[0]._M_str;
  pcVar12 = (buf->buffer_ptr)._M_elems[1]._M_str;
  (buf->buffer_ptr)._M_elems[0]._M_len = pbVar1->_M_len;
  (buf->buffer_ptr)._M_elems[0]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[2]._M_str;
  pbVar1->_M_len = pbVar2->_M_len;
  (buf->buffer_ptr)._M_elems[1]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[3]._M_str;
  pbVar2->_M_len = pbVar3->_M_len;
  (buf->buffer_ptr)._M_elems[2]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[4]._M_str;
  pbVar3->_M_len = pbVar4->_M_len;
  (buf->buffer_ptr)._M_elems[3]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[5]._M_str;
  pbVar4->_M_len = pbVar5->_M_len;
  (buf->buffer_ptr)._M_elems[4]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[6]._M_str;
  pbVar5->_M_len = pbVar6->_M_len;
  (buf->buffer_ptr)._M_elems[5]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[7]._M_str;
  pbVar6->_M_len = pbVar7->_M_len;
  (buf->buffer_ptr)._M_elems[6]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[8]._M_str;
  pbVar7->_M_len = pbVar9->_M_len;
  (buf->buffer_ptr)._M_elems[7]._M_str = pcVar12;
  pcVar12 = (buf->buffer_ptr)._M_elems[9]._M_str;
  pbVar9->_M_len = pbVar10->_M_len;
  (buf->buffer_ptr)._M_elems[8]._M_str = pcVar12;
  pbVar10->_M_len = (size_t)local_88._M_value.factor;
  (buf->buffer_ptr)._M_elems[9]._M_str = (char *)local_88._M_value.name._M_len;
  sVar27 = stream_buffer::next_token(buf);
  (buf->buffer_ptr)._M_elems[9] = sVar27;
LAB_00133b62:
  iVar19 = problem_parser::get_or_assign_variable(p,value_01);
  if (iVar19 == -1) {
LAB_00133fdd:
    uVar24 = 0xb;
    goto LAB_00134094;
  }
  poVar13 = (p->m_problem).objective.qelements.
            super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  poVar23 = (p->m_problem).objective.qelements.
            super__Vector_base<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar24 = (long)poVar13 - (long)poVar23;
  if (0 < (long)uVar24 >> 6) {
    lVar25 = ((long)uVar24 >> 6) + 1;
    poVar22 = (pointer)((long)&poVar23->factor + (uVar24 & 0xffffffffffffffc0));
    poVar23 = poVar23 + 2;
    do {
      if ((poVar23[-2].variable_index_a == iVar19) && (poVar23[-2].variable_index_b == iVar19)) {
        poVar23 = poVar23 + -2;
        goto LAB_00133cda;
      }
      if ((poVar23[-1].variable_index_a == iVar19) && (poVar23[-1].variable_index_b == iVar19)) {
        poVar23 = poVar23 + -1;
        goto LAB_00133cda;
      }
      if ((poVar23->variable_index_a == iVar19) && (poVar23->variable_index_b == iVar19))
      goto LAB_00133cda;
      if ((poVar23[1].variable_index_a == iVar19) && (poVar23[1].variable_index_b == iVar19)) {
        poVar23 = poVar23 + 1;
        goto LAB_00133cda;
      }
      lVar25 = lVar25 + -1;
      poVar23 = poVar23 + 4;
    } while (1 < lVar25);
    uVar24 = (long)poVar13 - (long)poVar22;
    poVar23 = poVar22;
  }
  lVar25 = (long)uVar24 >> 4;
  if (lVar25 == 1) {
LAB_00133c2c:
    if (iVar19 != poVar23->variable_index_b || poVar23->variable_index_a != iVar19) {
      poVar23 = poVar13;
    }
  }
  else if (lVar25 == 2) {
LAB_00133c1e:
    if ((poVar23->variable_index_a != iVar19) || (poVar23->variable_index_b != iVar19)) {
      poVar23 = poVar23 + 1;
      goto LAB_00133c2c;
    }
  }
  else {
    if (lVar25 != 3) goto LAB_00133d00;
    if ((poVar23->variable_index_a != iVar19) || (poVar23->variable_index_b != iVar19)) {
      poVar23 = poVar23 + 1;
      goto LAB_00133c1e;
    }
  }
LAB_00133cda:
  if (poVar23 != poVar13) {
    poVar23->factor = (double)uVar18 * sign_factor * 0.5 + poVar23->factor;
    goto LAB_001337e6;
  }
LAB_00133d00:
  pvVar21 = std::
            vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
            ::emplace_back<>(local_60);
  pvVar21->factor = (double)uVar18 * sign_factor * 0.5;
  pvVar21->variable_index_a = iVar19;
  pvVar21->variable_index_b = iVar19;
  goto LAB_001337e6;
}

Assistant:

raw_problem_status
read_quadratic_element(stream_buffer& buf,
                       problem_parser& p,
                       double sign_factor) noexcept
{
    if (buf.first() != "[")
        return baryonyx::file_format_error_tag::bad_objective_quadratic;

    buf.pop_front();

    while (!buf.first().empty() && buf.first() != "]") {
        function_element_token fct;

        if (auto fct_opt =
              read_quadratic_element(buf.first(), buf.second(), buf.third());
            !fct_opt)
            return baryonyx::file_format_error_tag::bad_objective_quadratic;
        else
            fct = *fct_opt;

        buf.pop_front(fct.read);

        if (buf.first() == "*") {
            auto name_opt = read_name(buf.second());
            if (!name_opt.has_value())
                return baryonyx::file_format_error_tag::
                  bad_objective_quadratic;

            auto id1 = p.get_or_assign_variable(fct.name);
            auto id2 = p.get_or_assign_variable(*name_opt);

            if (id1 == -1 || id2 == -1)
                return baryonyx::file_format_error_tag::too_many_variables;

            auto it = std::find_if(p.m_problem.objective.qelements.begin(),
                                   p.m_problem.objective.qelements.end(),
                                   [id1, id2](const auto& elem) {
                                       return (elem.variable_index_a == id1 &&
                                               elem.variable_index_b == id2) ||
                                              (elem.variable_index_a == id2 &&
                                               elem.variable_index_b == id1);
                                   });
            if (it == p.m_problem.objective.qelements.end()) {
                auto& ret = p.m_problem.objective.qelements.emplace_back();
                ret.factor = fct.factor * sign_factor / 2.0;
                ret.variable_index_a = id1;
                ret.variable_index_b = id2;
            } else {
                it->factor += fct.factor * sign_factor / 2.0;
            }

            buf.pop_front(2);
        } else if (buf.first() == "^" || buf.first() == "^2") {
            if (buf.first() == "^" && buf.second() == "2")
                buf.pop_front(2);
            else
                buf.pop_front(1);

            auto id = p.get_or_assign_variable(fct.name);
            if (id == -1)
                return baryonyx::file_format_error_tag::too_many_variables;

            auto it = std::find_if(p.m_problem.objective.qelements.begin(),
                                   p.m_problem.objective.qelements.end(),
                                   [id](const auto& elem) {
                                       return elem.variable_index_a == id &&
                                              elem.variable_index_b == id;
                                   });

            if (it == p.m_problem.objective.qelements.end()) {
                auto& ret = p.m_problem.objective.qelements.emplace_back();
                ret.factor = fct.factor * sign_factor / 2.0;
                ret.variable_index_a = id;
                ret.variable_index_b = id;
            } else {
                it->factor += fct.factor * sign_factor / 2.0;
            }
        }
    }

    buf.pop_front();

    if (buf.first() == "/" && buf.second() == "2")
        buf.pop_front(2);
    else if (buf.first() == "/2")
        buf.pop_front(1);
    else
        return baryonyx::file_format_error_tag::bad_objective_quadratic;

    return baryonyx::file_format_error_tag::success;
}